

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::App::help(App *this,string *prev,AppFormatMode mode)

{
  bool bVar1;
  reference ppAVar2;
  element_type *peVar3;
  uint in_ECX;
  App *in_RDX;
  App *in_RSI;
  string *in_RDI;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  App *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  value_type this_00;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  AppFormatMode in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  App *this_01;
  
  this_01 = in_RDX;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x187472);
  if (bVar1) {
    get_name_abi_cxx11_(in_RSI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff18);
  }
  else {
    get_name_abi_cxx11_(in_RSI);
    ::std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_ffffffffffffff20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff18);
    ::std::__cxx11::string::~string(in_stack_ffffffffffffff20);
  }
  get_subcommands(in_stack_ffffffffffffff18);
  bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                    ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)in_RDX);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1875cb);
    ::std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    (*peVar3->_vptr_FormatterBase[2])(in_RDI,peVar3,in_RSI,local_b0,(ulong)in_ECX);
    ::std::__cxx11::string::~string(in_stack_ffffffffffffff20);
  }
  else {
    ppAVar2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::back
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)
                         in_stack_ffffffffffffff20);
    this_00 = *ppAVar2;
    ::std::__cxx11::string::string(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    help(this_01,(string *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)in_RDX);
  return in_RDI;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string App::help(std::string prev, AppFormatMode mode) const {
    if(prev.empty())
        prev = get_name();
    else
        prev += " " + get_name();

    // Delegate to subcommand if needed
    auto selected_subcommands = get_subcommands();
    if(!selected_subcommands.empty()) {
        return selected_subcommands.back()->help(prev, mode);
    }
    return formatter_->make_help(this, prev, mode);
}